

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUAccelCal.cpp
# Opt level: O0

bool __thiscall RTIMUAccelCal::accelCalSave(RTIMUAccelCal *this)

{
  bool bVar1;
  RTIMUAccelCal *this_local;
  
  bVar1 = accelCalValid(this);
  if (bVar1) {
    this->m_settings->m_accelCalValid = true;
    RTVector3::operator=(&this->m_settings->m_accelCalMin,&this->m_accelMin);
    RTVector3::operator=(&this->m_settings->m_accelCalMax,&this->m_accelMax);
    (*(this->m_settings->super_RTIMUHal)._vptr_RTIMUHal[3])();
  }
  return bVar1;
}

Assistant:

bool RTIMUAccelCal::accelCalSave()
{
    if (!accelCalValid())
        return false;

    m_settings->m_accelCalValid = true;
    m_settings->m_accelCalMin = m_accelMin;
    m_settings->m_accelCalMax = m_accelMax;
    m_settings->saveSettings();
    return true;
}